

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void duckdb_re2::FactorAlternationImpl::Round3
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<duckdb_re2::Splice,_std::allocator<duckdb_re2::Splice>_> *splices)

{
  Regexp *pRVar1;
  Rune *pRVar2;
  ostream *poVar3;
  CharClass *pCVar4;
  long lVar5;
  ulong uVar6;
  Rune *pRVar7;
  ulong uVar8;
  CharClassBuilder ccb;
  Regexp *re;
  int local_244;
  long local_240;
  vector<duckdb_re2::Splice,std::allocator<duckdb_re2::Splice>> *local_238;
  Regexp *local_230;
  long local_228;
  ulong local_220;
  ulong local_218;
  string local_210;
  CharClassBuilder local_1f0;
  Regexp *local_1b0;
  ostringstream local_1a8 [376];
  
  lVar5 = (long)nsub;
  local_230 = (Regexp *)0x0;
  uVar8 = 0;
  local_240 = lVar5;
  local_238 = (vector<duckdb_re2::Splice,std::allocator<duckdb_re2::Splice>> *)splices;
  for (uVar6 = 0; (long)uVar6 <= lVar5; uVar6 = uVar6 + 1) {
    pRVar1 = local_230;
    if ((((lVar5 <= (long)uVar6) || (pRVar1 = sub[uVar6], local_230 == (Regexp *)0x0)) ||
        ((local_230->op_ != '\x14' && (local_230->op_ != '\x03')))) ||
       ((pRVar1->op_ != '\x03' && (pRVar1->op_ != '\x14')))) {
      local_230 = pRVar1;
      if (uVar6 != (int)uVar8 + 1 && uVar6 != uVar8) {
        CharClassBuilder::CharClassBuilder(&local_1f0);
        lVar5 = (long)(int)uVar8;
        local_228 = lVar5;
        local_220 = uVar8;
        local_218 = uVar6;
        for (; uVar6 = local_218, lVar5 < (long)local_218; lVar5 = lVar5 + 1) {
          pRVar1 = sub[lVar5];
          if (pRVar1->op_ == '\x03') {
            CharClassBuilder::AddRangeFlags
                      (&local_1f0,(pRVar1->arguments).rune_,(pRVar1->arguments).rune_,
                       (uint)pRVar1->parse_flags_);
          }
          else if (pRVar1->op_ == '\x14') {
            pCVar4 = (pRVar1->arguments).char_class.cc_;
            pRVar2 = *(Rune **)(pCVar4 + 8);
            for (pRVar7 = pRVar2; pRVar7 != pRVar2 + (long)*(int *)(pCVar4 + 0x10) * 2;
                pRVar7 = pRVar7 + 2) {
              CharClassBuilder::AddRange(&local_1f0,*pRVar7,pRVar7[1]);
              pRVar2 = *(Rune **)(pCVar4 + 8);
            }
          }
          else {
            local_1b0 = (Regexp *)((ulong)local_1b0 & 0xffffffffffffff00);
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            poVar3 = std::operator<<((ostream *)local_1a8,"RE2: unexpected op: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)pRVar1->op_);
            poVar3 = std::operator<<(poVar3," ");
            Regexp::ToString_abi_cxx11_(&local_210,pRVar1);
            std::operator<<(poVar3,(string *)&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
          }
          Regexp::Decref(pRVar1);
        }
        pCVar4 = CharClassBuilder::GetCharClass(&local_1f0);
        local_1b0 = Regexp::NewCharClass(pCVar4,flags);
        uVar8 = local_220;
        local_210._M_dataplus._M_p = (pointer)(sub + local_228);
        local_244 = (int)uVar6 - (int)local_220;
        std::vector<duckdb_re2::Splice,std::allocator<duckdb_re2::Splice>>::
        emplace_back<duckdb_re2::Regexp*&,duckdb_re2::Regexp**,int>
                  (local_238,&local_1b0,(Regexp ***)&local_210,&local_244);
        std::
        _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
        ::~_Rb_tree(&local_1f0.ranges_._M_t);
        lVar5 = local_240;
      }
      uVar8 = uVar8 & 0xffffffff;
      if ((long)uVar6 < lVar5) {
        uVar8 = uVar6 & 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void FactorAlternationImpl::Round3(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 3: Merge runs of literals and/or character classes.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // are either literals (i.e. runes) or character classes.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = sub[i];
      if (first != NULL &&
          (first->op() == kRegexpLiteral ||
           first->op() == kRegexpCharClass) &&
          (first_i->op() == kRegexpLiteral ||
           first_i->op() == kRegexpCharClass))
        continue;
    }

    // Found end of a run of Literal/CharClass:
    // sub[start:i] all are either one or the other,
    // but sub[i] is not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      Regexp* re = Regexp::NewCharClass(ccb.GetCharClass(), flags);
      splices->emplace_back(re, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}